

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_paged_audio_buffer_data_get_length_in_pcm_frames
                    (ma_paged_audio_buffer_data *pData,ma_uint64 *pLength)

{
  ma_paged_audio_buffer_page *local_58;
  ma_paged_audio_buffer_page *pPage;
  ma_uint64 *pLength_local;
  ma_paged_audio_buffer_data *pData_local;
  
  if (pLength == (ma_uint64 *)0x0) {
    pData_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0;
    if (pData == (ma_paged_audio_buffer_data *)0x0) {
      pData_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      for (local_58 = (pData->head).pNext; local_58 != (ma_paged_audio_buffer_page *)0x0;
          local_58 = local_58->pNext) {
        *pLength = local_58->sizeInFrames + *pLength;
      }
      pData_local._4_4_ = MA_SUCCESS;
    }
  }
  return pData_local._4_4_;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_get_length_in_pcm_frames(ma_paged_audio_buffer_data* pData, ma_uint64* pLength)
{
    ma_paged_audio_buffer_page* pPage;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Calculate the length from the linked list. */
    for (pPage = (ma_paged_audio_buffer_page*)c89atomic_load_ptr(&pData->head.pNext); pPage != NULL; pPage = (ma_paged_audio_buffer_page*)c89atomic_load_ptr(&pPage->pNext)) {
        *pLength += pPage->sizeInFrames;
    }

    return MA_SUCCESS;
}